

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.h
# Opt level: O3

bool __thiscall CNetMsg_Cl_SkinChange::Pack(CNetMsg_Cl_SkinChange *this,CMsgPacker *pPacker)

{
  CPacker::AddString(&pPacker->super_CPacker,this->m_apSkinPartNames[0],-1);
  CPacker::AddString(&pPacker->super_CPacker,this->m_apSkinPartNames[1],-1);
  CPacker::AddString(&pPacker->super_CPacker,this->m_apSkinPartNames[2],-1);
  CPacker::AddString(&pPacker->super_CPacker,this->m_apSkinPartNames[3],-1);
  CPacker::AddString(&pPacker->super_CPacker,this->m_apSkinPartNames[4],-1);
  CPacker::AddString(&pPacker->super_CPacker,this->m_apSkinPartNames[5],-1);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aUseCustomColors[0]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aUseCustomColors[1]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aUseCustomColors[2]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aUseCustomColors[3]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aUseCustomColors[4]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aUseCustomColors[5]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aSkinPartColors[0]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aSkinPartColors[1]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aSkinPartColors[2]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aSkinPartColors[3]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aSkinPartColors[4]);
  CPacker::AddInt(&pPacker->super_CPacker,this->m_aSkinPartColors[5]);
  return (pPacker->super_CPacker).m_Error != 0;
}

Assistant:

bool Pack(CMsgPacker *pPacker)
	{
		pPacker->AddString(m_apSkinPartNames[0], -1);
		pPacker->AddString(m_apSkinPartNames[1], -1);
		pPacker->AddString(m_apSkinPartNames[2], -1);
		pPacker->AddString(m_apSkinPartNames[3], -1);
		pPacker->AddString(m_apSkinPartNames[4], -1);
		pPacker->AddString(m_apSkinPartNames[5], -1);
		pPacker->AddInt(m_aUseCustomColors[0]);
		pPacker->AddInt(m_aUseCustomColors[1]);
		pPacker->AddInt(m_aUseCustomColors[2]);
		pPacker->AddInt(m_aUseCustomColors[3]);
		pPacker->AddInt(m_aUseCustomColors[4]);
		pPacker->AddInt(m_aUseCustomColors[5]);
		pPacker->AddInt(m_aSkinPartColors[0]);
		pPacker->AddInt(m_aSkinPartColors[1]);
		pPacker->AddInt(m_aSkinPartColors[2]);
		pPacker->AddInt(m_aSkinPartColors[3]);
		pPacker->AddInt(m_aSkinPartColors[4]);
		pPacker->AddInt(m_aSkinPartColors[5]);
		return pPacker->Error() != 0;
	}